

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O0

int luabridge::detail::CFunc::getVariable<int>(lua_State *L)

{
  int iVar1;
  int *piVar2;
  int *ptr;
  lua_State *L_local;
  
  iVar1 = lua_type(L,-0xf4629);
  if (iVar1 != 2) {
    __assert_fail("lua_islightuserdata(L, lua_upvalueindex(1))",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                  ,0xce,"static int luabridge::detail::CFunc::getVariable(lua_State *) [T = int]");
  }
  piVar2 = (int *)lua_touserdata(L,-0xf4629);
  if (piVar2 != (int *)0x0) {
    Stack<int>::push(L,*piVar2);
    return 1;
  }
  __assert_fail("ptr != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/CFunctions.h"
                ,0xd0,"static int luabridge::detail::CFunc::getVariable(lua_State *) [T = int]");
}

Assistant:

static int getVariable(lua_State* L)
    {
        assert(lua_islightuserdata(L, lua_upvalueindex(1)));
        T const* ptr = static_cast<T const*>(lua_touserdata(L, lua_upvalueindex(1)));
        assert(ptr != 0);
        Stack<T>::push(L, *ptr);
        return 1;
    }